

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall webrtc::Config::~Config(Config *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  Config *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
       ::begin(&this->options_);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
         ::end(&this->options_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>
             ::operator->(&local_18);
    if (ppVar2->second != (BaseOption *)0x0) {
      (**(code **)(*(long *)ppVar2->second + 8))();
    }
    std::_Rb_tree_iterator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>::
    operator++(&local_18);
  }
  std::
  map<webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*,_std::less<webrtc::ConfigOptionID>,_std::allocator<std::pair<const_webrtc::ConfigOptionID,_webrtc::Config::BaseOption_*>_>_>
  ::~map(&this->options_);
  return;
}

Assistant:

~Config() {
    // Note: this method is inline so webrtc public API depends only
    // on the headers.
    for (OptionMap::iterator it = options_.begin();
         it != options_.end(); ++it) {
      delete it->second;
    }
  }